

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_3> *
tcu::operator/(Matrix<float,_4,_3> *__return_storage_ptr__,Matrix<float,_4,_3> *mtx,float scalar)

{
  undefined1 auVar1 [16];
  Vector<float,_4> *pVVar2;
  long lVar3;
  Matrix<float,_4,_3> *res;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar9;
  undefined4 uVar10;
  long lVar8;
  
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[2].m_data[2] = 0.0;
  pVVar2[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[1].m_data[2] = 0.0;
  pVVar2[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  auVar1 = _DAT_019fcc00;
  auVar6 = _DAT_019f5ce0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar7 = auVar1;
    do {
      bVar9 = SUB164(auVar7 ^ auVar6,4) == -0x80000000 && SUB164(auVar7 ^ auVar6,0) < -0x7ffffffd;
      if (bVar9) {
        uVar10 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar10 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar2 + -1))->m_data[0].m_data + lVar5) =
             uVar10;
      }
      if (bVar9) {
        uVar10 = 0x3f800000;
        if (lVar3 + -0x10 != lVar5) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pVVar2->m_data + lVar5) = uVar10;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x40);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x10;
    pVVar2 = (Vector<float,_4> *)(pVVar2->m_data + 1);
  } while (lVar4 != 4);
  lVar3 = 0;
  do {
    auVar6._4_4_ = scalar;
    auVar6._0_4_ = scalar;
    auVar6._8_4_ = scalar;
    auVar6._12_4_ = scalar;
    auVar6 = divps(*(undefined1 (*) [16])((long)(mtx->m_data).m_data[0].m_data + lVar3),auVar6);
    *(undefined1 (*) [16])((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar3) = auVar6
    ;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x30);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) / scalar;
	return res;
}